

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall spvtools::val::Function::ComputeAugmentedCFG(Function *this)

{
  get_blocks_func local_58;
  get_blocks_func local_38;
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  anon_class_1_0_00000001 pred_func;
  Function *pFStack_10;
  anon_class_1_0_00000001 succ_func;
  Function *this_local;
  
  pFStack_10 = this;
  std::
  function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>
  ::function<spvtools::val::Function::ComputeAugmentedCFG()::__0&,void>
            ((function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>
              *)&local_38,&local_11);
  std::
  function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>
  ::function<spvtools::val::Function::ComputeAugmentedCFG()::__1&,void>
            ((function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>
              *)&local_58,&local_12);
  CFA<spvtools::val::BasicBlock>::ComputeAugmentedCFG
            (&this->ordered_blocks_,&this->pseudo_entry_block_,&this->pseudo_exit_block_,
             &this->augmented_successors_map_,&this->augmented_predecessors_map_,&local_38,&local_58
            );
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function(&local_58);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function(&local_38);
  return;
}

Assistant:

void Function::ComputeAugmentedCFG() {
  // Compute the successors of the pseudo-entry block, and
  // the predecessors of the pseudo exit block.
  auto succ_func = [](const BasicBlock* b) {
    return b->structural_successors();
  };
  auto pred_func = [](const BasicBlock* b) {
    return b->structural_predecessors();
  };
  CFA<BasicBlock>::ComputeAugmentedCFG(
      ordered_blocks_, &pseudo_entry_block_, &pseudo_exit_block_,
      &augmented_successors_map_, &augmented_predecessors_map_, succ_func,
      pred_func);
}